

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunTest.h
# Opt level: O0

int getNumWidth(size_t n)

{
  undefined4 local_14;
  size_t sStack_10;
  int w;
  size_t n_local;
  
  local_14 = 1;
  for (sStack_10 = n; 9 < sStack_10; sStack_10 = sStack_10 / 10) {
    local_14 = local_14 + 1;
  }
  return local_14;
}

Assistant:

inline int getNumWidth(size_t n)
{
  int w = 1;
  while (n >= 10) {
    n /= 10;
    ++w;
  }
  return w;
}